

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialogPrivate::layout(QProgressDialogPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QProgressDialog *pQVar6;
  QStyle *pQVar7;
  int *piVar8;
  QProgressDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  int attempt;
  int lh;
  int cspc;
  int additionalSpacing;
  bool centered;
  int mr;
  int ml;
  int mb;
  int sp;
  QProgressDialog *q;
  QSize bh;
  QSize cs;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  QSize *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QWidget *in_stack_ffffffffffffff38;
  int local_84;
  int local_74;
  int local_70;
  int local_58;
  int local_54;
  int local_40 [3];
  int local_34;
  int local_30 [2];
  undefined1 *local_28;
  undefined1 *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = q_func(in_RDI);
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_54 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x50,0,pQVar6);
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_58 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x4e,0,pQVar6);
  local_c = QWidget::width((QWidget *)0x7b0959);
  local_c = local_c / 10;
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_10 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x4b,0,pQVar6);
  piVar8 = qMin<int>(&local_c,&local_10);
  iVar1 = *piVar8;
  local_14 = QWidget::width((QWidget *)0x7b09c2);
  local_14 = local_14 / 10;
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_18 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x4d,0,pQVar6);
  piVar8 = qMin<int>(&local_14,&local_18);
  iVar5 = *piVar8;
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  iVar2 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,9,0,pQVar6);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RDI->cancel == (QPushButton *)0x0) {
    QSize::QSize(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  }
  else {
    local_20 = (undefined1 *)
               (**(code **)(*(long *)&(in_RDI->cancel->super_QAbstractButton).super_QWidget + 0x70))
                         ();
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (undefined1 *)(**(code **)(*(long *)&in_RDI->bar->super_QWidget + 0x70))();
  local_70 = 0;
  local_74 = 5;
  while (local_74 != 0) {
    if (in_RDI->cancel == (QPushButton *)0x0) {
      local_84 = 0;
    }
    else {
      local_84 = QSize::height((QSize *)0x7b0b27);
      local_84 = local_84 + local_54;
    }
    local_30[1] = 0;
    iVar3 = QWidget::height((QWidget *)0x7b0b5c);
    iVar4 = QSize::height((QSize *)0x7b0b74);
    local_30[0] = (((iVar3 - local_58) - iVar4) - local_54) - local_84;
    piVar8 = qMax<int>(local_30 + 1,local_30);
    local_70 = *piVar8;
    iVar3 = QWidget::height((QWidget *)0x7b0bbe);
    if (iVar3 / 4 <= local_70) break;
    local_54 = local_54 / 2;
    local_58 = local_58 / 2;
    if (in_RDI->cancel != (QPushButton *)0x0) {
      local_34 = 4;
      iVar3 = QSize::height((QSize *)0x7b0c29);
      local_40[2] = (iVar3 - local_54) + -2;
      qMax<int>(&local_34,local_40 + 2);
      QSize::setHeight(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
    local_40[1] = 4;
    iVar3 = QSize::height((QSize *)0x7b0c76);
    local_40[0] = (iVar3 - local_54) + -1;
    qMax<int>(local_40 + 1,local_40);
    QSize::setHeight(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_74 = local_74 + -1;
  }
  if (in_RDI->cancel != (QPushButton *)0x0) {
    if (iVar2 == 0) {
      QWidget::width((QWidget *)0x7b0d2b);
      QSize::width((QSize *)0x7b0d43);
    }
    else {
      QWidget::width((QWidget *)0x7b0cef);
      QSize::width((QSize *)0x7b0d08);
    }
    QWidget::height((QWidget *)0x7b0d64);
    QSize::height((QSize *)0x7b0d7c);
    QSize::width((QSize *)0x7b0d95);
    QSize::height((QSize *)0x7b0da6);
    QWidget::setGeometry
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  }
  if (in_RDI->label != (QLabel *)0x0) {
    in_stack_ffffffffffffff38 = (QWidget *)in_RDI->label;
    QWidget::width((QWidget *)0x7b0e02);
    QWidget::setGeometry
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  }
  local_70 = local_70 + local_54;
  iVar2 = iVar1;
  iVar3 = QWidget::width((QWidget *)0x7b0e6c);
  iVar5 = (iVar3 - iVar1) - iVar5;
  QSize::height((QSize *)0x7b0e8f);
  QWidget::setGeometry(in_stack_ffffffffffffff38,iVar5,local_70,iVar2,in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressDialogPrivate::layout()
{
    Q_Q(QProgressDialog);
    int sp = q->style()->pixelMetric(QStyle::PM_LayoutVerticalSpacing, nullptr, q);
    int mb = q->style()->pixelMetric(QStyle::PM_LayoutBottomMargin, nullptr, q);
    int ml = qMin(q->width() / 10, q->style()->pixelMetric(QStyle::PM_LayoutLeftMargin, nullptr, q));
    int mr = qMin(q->width() / 10, q->style()->pixelMetric(QStyle::PM_LayoutRightMargin, nullptr, q));
    const bool centered =
        bool(q->style()->styleHint(QStyle::SH_ProgressDialog_CenterCancelButton, nullptr, q));

    int additionalSpacing = 0;
    QSize cs = cancel ? cancel->sizeHint() : QSize(0,0);
    QSize bh = bar->sizeHint();
    int cspc;
    int lh = 0;

    // Find spacing and sizes that fit.  It is important that a progress
    // dialog can be made very small if the user demands it so.
    for (int attempt=5; attempt--;) {
        cspc = cancel ? cs.height() + sp : 0;
        lh = qMax(0, q->height() - mb - bh.height() - sp - cspc);

        if (lh < q->height()/4) {
            // Getting cramped
            sp /= 2;
            mb /= 2;
            if (cancel) {
                cs.setHeight(qMax(4,cs.height()-sp-2));
            }
            bh.setHeight(qMax(4,bh.height()-sp-1));
        } else {
            break;
        }
    }

    if (cancel) {
        cancel->setGeometry(
            centered ? q->width()/2 - cs.width()/2 : q->width() - mr - cs.width(),
            q->height() - mb - cs.height(),
            cs.width(), cs.height());
    }

    if (label)
        label->setGeometry(ml, additionalSpacing, q->width() - ml - mr, lh);
    bar->setGeometry(ml, lh + sp + additionalSpacing, q->width() - ml - mr, bh.height());
}